

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crnlib.cpp
# Opt level: O0

char * crn_get_mip_mode_name(crn_mip_mode m)

{
  char *pcStack_10;
  crn_mip_mode m_local;
  
  switch(m) {
  case cCRNMipModeUseSourceOrGenerateMips:
    pcStack_10 = "UseSourceOrGenerate";
    break;
  case cCRNMipModeUseSourceMips:
    pcStack_10 = "UseSource";
    break;
  case cCRNMipModeGenerateMips:
    pcStack_10 = "Generate";
    break;
  case cCRNMipModeNoMips:
    pcStack_10 = "None";
    break;
  default:
    pcStack_10 = "?";
  }
  return pcStack_10;
}

Assistant:

const char* crn_get_mip_mode_name(crn_mip_mode m) {
  switch (m) {
    case cCRNMipModeUseSourceOrGenerateMips:
      return "UseSourceOrGenerate";
    case cCRNMipModeUseSourceMips:
      return "UseSource";
    case cCRNMipModeGenerateMips:
      return "Generate";
    case cCRNMipModeNoMips:
      return "None";
    default:
      break;
  }
  return "?";
}